

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeBase *
CreateGenericTypeInstance
          (ExpressionContext *ctx,SynBase *source,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> *types)

{
  __jmp_buf_tag *__env;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  Node *pNVar4;
  ScopeData *pSVar5;
  TypeHandle *pTVar6;
  uint uVar7;
  int iVar8;
  ExprBase *node;
  size_t sVar9;
  char *dst;
  char *pcVar10;
  char *pcVar11;
  undefined1 auVar12 [16];
  InplaceStr IVar13;
  jmp_buf prevErrorHandler;
  undefined1 local_f8 [200];
  
  IVar13 = GetGenericClassTypeName(ctx,&proto->super_TypeBase,*types);
  uVar7 = NULLC::GetStringHash(IVar13.begin,IVar13.end);
  for (pNVar4 = (ctx->genericTypeMap).entries[uVar7 & 0x3ff]; pNVar4 != (Node *)0x0;
      pNVar4 = pNVar4->next) {
    if (pNVar4->hash == uVar7) {
      return (TypeBase *)pNVar4->value;
    }
  }
  pSVar5 = ctx->scope;
  uVar1 = proto->source;
  uVar2 = proto->scope;
  auVar12._8_4_ = (int)uVar1;
  auVar12._0_8_ = uVar2;
  auVar12._12_4_ = (int)((ulong)uVar1 >> 0x20);
  ctx->scope = (ScopeData *)uVar2;
  ctx->lookupLocation = (SynBase *)auVar12._8_8_;
  __env = ctx->errorHandler;
  memcpy(local_f8,__env,200);
  bVar3 = ctx->errorHandlerNested;
  ctx->errorHandlerNested = true;
  uVar7 = ctx->classInstanceDepth + 1;
  ctx->classInstanceDepth = uVar7;
  if (0x40 < uVar7) {
    anon_unknown.dwarf_9c70f::Stop
              (ctx,source,"ERROR: reached maximum generic type instance depth (%d)",0x40);
  }
  uVar7 = *(uint *)(NULLC::traceContext + 0x244);
  iVar8 = _setjmp((__jmp_buf_tag *)__env);
  if (iVar8 == 0) {
    node = AnalyzeClassDefinition(ctx,proto->definition,proto,*types);
    ctx->classInstanceDepth = ctx->classInstanceDepth - 1;
    ctx->scope = pSVar5;
    ctx->lookupLocation = (SynBase *)0x0;
    memcpy(__env,local_f8,200);
    ctx->errorHandlerNested = bVar3;
    if ((node != (ExprBase *)0x0) && (node->typeID == 0x2d)) {
      IntrusiveList<ExprBase>::push_back(&proto->instances,node);
      return (TypeBase *)node[1]._vptr_ExprBase;
    }
    anon_unknown.dwarf_9c70f::Stop
              (ctx,source,"ERROR: type \'%.*s\' couldn\'t be instantiated",
               (ulong)(uint)(*(int *)&(proto->super_TypeBase).name.end -
                            (int)(proto->super_TypeBase).name.begin));
  }
  NULLC::TraceLeaveTo(uVar7);
  ctx->classInstanceDepth = ctx->classInstanceDepth - 1;
  ctx->scope = pSVar5;
  ctx->lookupLocation = (SynBase *)0x0;
  pcVar11 = ctx->errorBuf;
  if (pcVar11 != (char *)0x0) {
    sVar9 = strlen(pcVar11);
    pcVar11 = pcVar11 + sVar9;
    iVar8 = NULLC::SafeSprintf(pcVar11,(ulong)(ctx->errorBufSize - (int)sVar9),
                               "while instantiating generic type %.*s<",
                               (ulong)(uint)(*(int *)&(proto->super_TypeBase).name.end -
                                            (int)(proto->super_TypeBase).name.begin));
    dst = pcVar11 + iVar8;
    for (pTVar6 = types->head; pTVar6 != (TypeHandle *)0x0; pTVar6 = pTVar6->next) {
      pcVar10 = ", ";
      if (pTVar6 == types->head) {
        pcVar10 = "";
      }
      iVar8 = NULLC::SafeSprintf(dst,(ulong)((*(int *)&ctx->errorBuf - (int)dst) + ctx->errorBufSize
                                            ),"%s%.*s",pcVar10,
                                 (ulong)(uint)(*(int *)&(pTVar6->type->name).end -
                                              (int)(pTVar6->type->name).begin));
      dst = dst + iVar8;
    }
    iVar8 = NULLC::SafeSprintf(dst,(ulong)((*(int *)&ctx->errorBuf - (int)dst) + ctx->errorBufSize),
                               ">");
    anon_unknown.dwarf_9c70f::AddRelatedErrorInfoWithLocation(ctx,source,pcVar11,dst + iVar8);
  }
  memcpy(__env,local_f8,200);
  ctx->errorHandlerNested = bVar3;
  longjmp((__jmp_buf_tag *)__env,1);
}

Assistant:

TypeBase* CreateGenericTypeInstance(ExpressionContext &ctx, SynBase *source, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> &types)
{
	InplaceStr className = GetGenericClassTypeName(ctx, proto, types);

	// Check if type already exists
	if(TypeClass **prev = ctx.genericTypeMap.find(className.hash()))
		return *prev;

	// Switch to original type scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(proto->scope, proto->source);

	ExprBase *result = NULL;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	ctx.classInstanceDepth++;

	if(ctx.classInstanceDepth > NULLC_MAX_GENERIC_INSTANCE_DEPTH)
		Stop(ctx, source, "ERROR: reached maximum generic type instance depth (%d)", NULLC_MAX_GENERIC_INSTANCE_DEPTH);

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		result = AnalyzeClassDefinition(ctx, proto->definition, proto, types);
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		ctx.classInstanceDepth--;

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		// Additional error info
		if(ctx.errorBuf)
		{
			char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

			const char *messageStart = errorCurr;

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "while instantiating generic type %.*s<", FMT_ISTR(proto->name));

			for(TypeHandle *curr = types.head; curr; curr = curr->next)
			{
				TypeBase *type = curr->type;

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", curr != types.head ? ", " : "", FMT_ISTR(type->name));
			}

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ">");

			const char *messageEnd = errorCurr;

			AddRelatedErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
		}

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	ctx.classInstanceDepth--;

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	if(ExprClassDefinition *definition = getType<ExprClassDefinition>(result))
	{
		proto->instances.push_back(result);

		return definition->classType;
	}

	Stop(ctx, source, "ERROR: type '%.*s' couldn't be instantiated", FMT_ISTR(proto->name));

	return NULL;
}